

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

timeval __thiscall absl::ToTimeval(absl *this,Duration d)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  timeval tVar4;
  
  uVar2 = (uint)d.rep_hi_;
  if (uVar2 == 0xffffffff) {
    bVar3 = -1 < (long)this;
    this = (absl *)0x8000000000000000;
    if (bVar3) {
      this = (absl *)0x7fffffffffffffff;
    }
    uVar2 = 999;
    if (bVar3) {
      uVar2 = 999999999;
    }
  }
  else if ((long)this < 0) {
    uVar1 = uVar2 + 3;
    if (uVar1 < 4000000000) {
      if (uVar1 < 0xee6b1864) {
        uVar2 = (uVar1 >> 2) + 999;
      }
      else {
        this = this + 1;
        uVar2 = (uVar1 >> 2) + 0xc46539e7;
      }
    }
    else {
      uVar1 = uVar2 + 0x1194d803 >> 2;
      bVar3 = this == (absl *)0xffffffffffffffff;
      this = this + 1;
      uVar2 = uVar1 + 999;
      if (bVar3) {
        uVar2 = uVar1;
      }
    }
  }
  else {
    uVar2 = uVar2 >> 2;
  }
  tVar4.tv_usec = (ulong)uVar2 / 1000;
  tVar4.tv_sec = (__time_t)this;
  return tVar4;
}

Assistant:

timeval ToTimeval(Duration d) {
  timeval tv;
  timespec ts = ToTimespec(d);
  if (ts.tv_sec < 0) {
    // Tweak the fields so that positive division of tv_nsec
    // maps to truncation (towards zero) for the timeval.
    ts.tv_nsec += 1000 - 1;
    if (ts.tv_nsec >= 1000 * 1000 * 1000) {
      ts.tv_sec += 1;
      ts.tv_nsec -= 1000 * 1000 * 1000;
    }
  }
  tv.tv_sec = ts.tv_sec;
  if (tv.tv_sec != ts.tv_sec) {  // narrowing
    if (ts.tv_sec < 0) {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::min();
      tv.tv_usec = 0;
    } else {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::max();
      tv.tv_usec = 1000 * 1000 - 1;
    }
    return tv;
  }
  tv.tv_usec = static_cast<int>(ts.tv_nsec / 1000);  // suseconds_t
  return tv;
}